

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O3

int __thiscall ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob)

{
  float fVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  Mat *dst;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  int iVar10;
  uint uVar11;
  void *pvVar12;
  ulong uVar13;
  void *pvVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  int iVar25;
  undefined1 auVar24 [16];
  undefined4 uVar26;
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar28 [16];
  int remain;
  vector<int,_std::allocator<int>_> _space_ofs;
  allocator_type local_119;
  ulong local_118;
  ulong local_110;
  Mat local_108;
  void *local_d8;
  ulong local_d0;
  ulong local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  Mat *local_b0;
  Deconvolution *local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  void *local_88;
  ulong local_80;
  long local_78;
  long local_70;
  Mat *local_68;
  void *local_60;
  long local_58;
  void *local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar11 = bottom_blob->w;
  local_90 = (ulong)uVar11;
  uVar19 = bottom_blob->h;
  local_98 = (ulong)uVar19;
  iVar25 = this->kernel_w;
  iVar10 = this->dilation_w;
  iVar29 = this->kernel_h;
  iVar21 = this->dilation_h;
  uVar2 = bottom_blob->c;
  iVar15 = this->stride_w;
  iVar16 = this->stride_h;
  local_108.data = top_blob->data;
  local_108.refcount = top_blob->refcount;
  local_108.elemsize = top_blob->elemsize;
  local_108.dims = top_blob->dims;
  if (local_108.refcount != (int *)0x0) {
    LOCK();
    *local_108.refcount = *local_108.refcount + 1;
    UNLOCK();
  }
  iVar10 = (iVar25 + -1) * iVar10 + (uVar11 - 1) * iVar15 + 1;
  uVar11 = (iVar29 + -1) * iVar21 + 1 + (uVar19 - 1) * iVar16;
  local_118 = (ulong)uVar11;
  local_108.w = top_blob->w;
  local_108.h = top_blob->h;
  local_108.c = top_blob->c;
  local_110 = top_blob->cstep;
  iVar25 = this->num_output;
  local_108.cstep = local_110;
  local_68 = bottom_blob;
  if ((((local_108.dims == 3) && (local_108.w == iVar10)) && (local_108.h == uVar11)) &&
     ((local_108.c == iVar25 && (local_108.elemsize == 4)))) {
    iVar25 = -100;
    local_108.dims = 3;
    local_108.elemsize = 4;
    local_d8 = local_108.data;
    local_b0 = top_blob;
    if ((local_108.data == (void *)0x0) || ((long)local_108.c * local_110 == 0)) goto LAB_0010da44;
  }
  else {
    if (local_108.refcount != (int *)0x0) {
      LOCK();
      *local_108.refcount = *local_108.refcount + -1;
      UNLOCK();
      if ((*local_108.refcount == 0) && (local_108.data != (void *)0x0)) {
        free(*(void **)((long)local_108.data - 8));
      }
    }
    local_108.data = (void *)0x0;
    local_108.refcount = (int *)0x0;
    local_108.elemsize = 4;
    local_108.dims = 3;
    local_108.h = (int)local_118;
    local_110 = (long)(local_108.h * iVar10) + 3U & 0x3ffffffffffffffc;
    lVar22 = (long)iVar25 * local_110;
    local_108.w = iVar10;
    local_108.c = iVar25;
    local_108.cstep = local_110;
    if (lVar22 == 0) {
      iVar25 = -100;
      goto LAB_0010da44;
    }
    local_b0 = top_blob;
    pvVar12 = malloc(lVar22 * 4 + 0x1c);
    local_d8 = (void *)((long)pvVar12 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)local_d8 - 8) = pvVar12;
    local_108.refcount = (int *)((long)local_d8 + lVar22 * 4);
    *local_108.refcount = 1;
  }
  uVar11 = this->kernel_w * this->kernel_h;
  local_108.data = local_d8;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)(int)uVar11,&local_119);
  dst = local_b0;
  iVar25 = this->kernel_h;
  if (0 < iVar25) {
    iVar29 = this->dilation_h;
    iVar21 = this->kernel_w;
    iVar15 = this->dilation_w * iVar21;
    iVar16 = 0;
    iVar18 = 0;
    iVar20 = 0;
    do {
      if (0 < iVar21) {
        lVar22 = 0;
        do {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar20 + lVar22] = iVar18;
          iVar18 = iVar18 + this->dilation_w;
          iVar21 = this->kernel_w;
          lVar22 = lVar22 + 1;
        } while ((int)lVar22 < iVar21);
        iVar20 = iVar20 + (int)lVar22;
        iVar25 = this->kernel_h;
      }
      iVar18 = iVar18 + (iVar29 * iVar10 - iVar15);
      iVar16 = iVar16 + 1;
    } while (iVar16 < iVar25);
  }
  auVar8 = _DAT_00134480;
  auVar7 = _DAT_00134470;
  auVar6 = _DAT_00134400;
  local_78 = (long)this->num_output;
  if (0 < local_78) {
    local_110 = local_110 * 4;
    uVar19 = (int)local_118 * iVar10;
    local_118 = (ulong)uVar19;
    local_b8 = this->bias_term;
    local_88 = (this->bias_data).data;
    lVar22 = local_118 - 1;
    auVar24._8_4_ = (int)lVar22;
    auVar24._0_8_ = lVar22;
    auVar24._12_4_ = (int)((ulong)lVar22 >> 0x20);
    local_80 = local_118 + 3 & 0xfffffffffffffffc;
    local_bc = uVar2 * uVar11;
    local_d0 = 0;
    auVar24 = auVar24 ^ _DAT_00134400;
    lVar22 = 0;
    lVar9 = (long)local_d8 + 0xc;
    do {
      local_70 = lVar9;
      local_a0 = lVar22;
      if (local_b8 == 0) {
        uVar26 = 0;
      }
      else {
        uVar26 = *(undefined4 *)((long)local_88 + local_a0 * 4);
      }
      if (0 < (int)uVar19) {
        uVar13 = 0;
        do {
          auVar27._8_4_ = (int)uVar13;
          auVar27._0_8_ = uVar13;
          auVar27._12_4_ = (int)(uVar13 >> 0x20);
          auVar28 = (auVar27 | auVar8) ^ auVar6;
          iVar25 = auVar24._4_4_;
          if ((bool)(~(iVar25 < auVar28._4_4_ ||
                      auVar24._0_4_ < auVar28._0_4_ && auVar28._4_4_ == iVar25) & 1)) {
            *(undefined4 *)(local_70 + -0xc + uVar13 * 4) = uVar26;
          }
          if (auVar28._12_4_ <= auVar24._12_4_ &&
              (auVar28._8_4_ <= auVar24._8_4_ || auVar28._12_4_ != auVar24._12_4_)) {
            *(undefined4 *)(local_70 + -8 + uVar13 * 4) = uVar26;
          }
          auVar27 = (auVar27 | auVar7) ^ auVar6;
          iVar29 = auVar27._4_4_;
          if (iVar29 <= iVar25 && (iVar29 != iVar25 || auVar27._0_4_ <= auVar24._0_4_)) {
            *(undefined4 *)(local_70 + -4 + uVar13 * 4) = uVar26;
            *(undefined4 *)(local_70 + uVar13 * 4) = uVar26;
          }
          uVar13 = uVar13 + 4;
        } while (local_80 != uVar13);
      }
      if (0 < (int)local_98) {
        local_60 = (void *)(local_110 * local_a0 + (long)local_d8);
        local_b4 = this->stride_h * iVar10;
        local_58 = (long)this->stride_w;
        local_50 = (void *)((long)(int)local_d0 * 4 + (long)(this->weight_data).data);
        local_c8 = 0;
        do {
          if (0 < (int)local_90) {
            iVar25 = local_68->w;
            sVar3 = local_68->cstep;
            sVar4 = local_68->elemsize;
            pvVar12 = local_68->data;
            uVar13 = 0;
            do {
              if (0 < (int)uVar2) {
                lVar22 = uVar13 * local_58 * 4 + (long)(local_b4 * (int)local_c8) * 4;
                uVar17 = 0;
                pvVar14 = local_50;
                do {
                  if (0 < (int)uVar11) {
                    fVar1 = *(float *)((long)pvVar12 +
                                      sVar3 * sVar4 * uVar17 +
                                      uVar13 * 4 + (long)iVar25 * local_c8 * 4);
                    uVar23 = 0;
                    do {
                      *(float *)((long)local_60 +
                                (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start[uVar23] * 4 + lVar22) =
                           *(float *)((long)pvVar14 + uVar23 * 4) * fVar1 +
                           *(float *)((long)local_60 +
                                     (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar23] * 4 +
                                     lVar22);
                      uVar23 = uVar23 + 1;
                    } while (uVar11 != uVar23);
                  }
                  uVar17 = uVar17 + 1;
                  pvVar14 = (void *)((long)pvVar14 + (long)(int)uVar11 * 4);
                } while (uVar17 != uVar2);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != local_90);
          }
          local_c8 = local_c8 + 1;
        } while (local_c8 != local_98);
      }
      local_d0 = (ulong)(uint)((int)local_d0 + local_bc);
      lVar22 = local_a0 + 1;
      lVar9 = local_70 + local_110;
      local_a8 = this;
    } while (local_a0 + 1 != local_78);
  }
  if (&local_108 != local_b0) {
    if (local_108.refcount != (int *)0x0) {
      LOCK();
      *local_108.refcount = *local_108.refcount + 1;
      UNLOCK();
    }
    piVar5 = local_b0->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if ((*piVar5 == 0) && (local_b0->data != (void *)0x0)) {
        free(*(void **)((long)local_b0->data + -8));
      }
    }
    dst->data = local_108.data;
    dst->refcount = local_108.refcount;
    dst->elemsize = local_108.elemsize;
    dst->dims = local_108.dims;
    dst->w = local_108.w;
    dst->h = local_108.h;
    dst->c = local_108.c;
    dst->cstep = local_108.cstep;
  }
  iVar25 = this->pad_w;
  iVar10 = this->pad_h;
  if (iVar10 < 1 && iVar25 < 1) {
LAB_0010da1c:
    iVar25 = 0;
  }
  else {
    copy_cut_border(&local_108,dst,iVar10,iVar10,iVar25,iVar25);
    iVar25 = -100;
    if ((dst->data != (void *)0x0) && ((long)dst->c * dst->cstep != 0)) goto LAB_0010da1c;
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0010da44:
  if (local_108.refcount != (int *)0x0) {
    LOCK();
    *local_108.refcount = *local_108.refcount + -1;
    UNLOCK();
    if ((*local_108.refcount == 0) && (local_108.data != (void *)0x0)) {
      free(*(void **)((long)local_108.data - 8));
    }
  }
  return iVar25;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // backward strided convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;

//     fprintf(stderr, "Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered = top_blob;
    top_blob_bordered.create(outw, outh, num_output);
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for
    for (int p=0; p<num_output; p++)
    {
        Mat out = top_blob_bordered.channel(p);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i*stride_h) + j*stride_w;

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    float val = *(m.row(i) + j);

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }
    }

    top_blob = top_blob_bordered;

    if (pad_w > 0 || pad_h > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_h, pad_h, pad_w, pad_w);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }

    return 0;
}